

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_DistributionMapping.cpp
# Opt level: O3

DistributionMapping __thiscall
amrex::DistributionMapping::makeKnapSack
          (DistributionMapping *this,Vector<double,_std::allocator<double>_> *rcost,int nmax)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  long lVar5;
  double *pdVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  double *pdVar8;
  long lVar9;
  ulong uVar10;
  double dVar11;
  double dVar12;
  DistributionMapping DVar13;
  Vector<long,_std::allocator<long>_> cost;
  Real eff;
  vector<long,_std::allocator<long>_> local_40;
  allocator_type local_28 [8];
  
  p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x68);
  p_Var4->_M_use_count = 1;
  p_Var4->_M_weak_count = 1;
  p_Var4->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00713860;
  p_Var4[5]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var4[5]._M_use_count = 0;
  p_Var4[6]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var4[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var4[1]._M_use_count = 0;
  p_Var4[1]._M_weak_count = 0;
  p_Var4[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var4[2]._M_use_count = 0;
  p_Var4[2]._M_weak_count = 0;
  p_Var4[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var4[3]._M_use_count = 0;
  p_Var4[3]._M_weak_count = 0;
  *(undefined8 *)&p_Var4[3]._M_weak_count = 0;
  *(undefined8 *)((long)&p_Var4[4]._vptr__Sp_counted_base + 4) = 0;
  (this->m_ref).super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var4;
  (this->m_ref).super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)(p_Var4 + 1);
  std::vector<long,_std::allocator<long>_>::vector
            (&local_40,
             (long)(rcost->super_vector<double,_std::allocator<double>_>).
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(rcost->super_vector<double,_std::allocator<double>_>).
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3,local_28);
  pdVar1 = (rcost->super_vector<double,_std::allocator<double>_>).
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar2 = (rcost->super_vector<double,_std::allocator<double>_>).
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  pdVar8 = pdVar1 + 1;
  pdVar6 = pdVar1;
  if (pdVar8 != pdVar2 && pdVar1 != pdVar2) {
    dVar11 = *pdVar1;
    do {
      dVar12 = *pdVar8;
      pdVar3 = pdVar8;
      if (dVar12 <= dVar11) {
        dVar12 = dVar11;
        pdVar3 = pdVar6;
      }
      pdVar6 = pdVar3;
      pdVar8 = pdVar8 + 1;
      dVar11 = dVar12;
    } while (pdVar8 != pdVar2);
  }
  lVar5 = (long)pdVar2 - (long)pdVar1 >> 3;
  if (0 < lVar5) {
    dVar11 = *pdVar6;
    uVar10 = -(ulong)(dVar11 == 0.0);
    lVar9 = 0;
    do {
      local_40.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar9] =
           (long)(pdVar1[lVar9] *
                 (double)(uVar10 & 0x41cdcd6500000000 | ~uVar10 & (ulong)(1000000000.0 / dVar11))) +
           1;
      lVar9 = lVar9 + 1;
    } while (lVar5 != lVar9);
  }
  KnapSackProcessorMap
            (this,&local_40,*(int *)(DAT_0071a620 + -0x38),(Real *)local_28,true,nmax,true);
  _Var7._M_pi = extraout_RDX;
  if (local_40.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_40.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
    _Var7._M_pi = extraout_RDX_00;
  }
  DVar13.m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var7._M_pi;
  DVar13.m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (DistributionMapping)
         DVar13.m_ref.
         super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

DistributionMapping
DistributionMapping::makeKnapSack (const Vector<Real>& rcost, int nmax)
{
    BL_PROFILE("makeKnapSack");

    DistributionMapping r;

    Vector<Long> cost(rcost.size());

    Real wmax = *std::max_element(rcost.begin(), rcost.end());
    Real scale = (wmax == 0) ? 1.e9_rt : 1.e9_rt/wmax;

    for (int i = 0; i < rcost.size(); ++i) {
        cost[i] = Long(rcost[i]*scale) + 1L;
    }

    int nprocs = ParallelContext::NProcsSub();
    Real eff;

    r.KnapSackProcessorMap(cost, nprocs, &eff, true, nmax);

    return r;
}